

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,void **data,void *defaultValue,int defaultSize)

{
  void *pvVar1;
  int local_44;
  char *pcStack_40;
  int dsize;
  char *v;
  void *pvStack_30;
  int defaultSize_local;
  void *defaultValue_local;
  void **data_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  v._4_4_ = defaultSize;
  pvStack_30 = defaultValue;
  defaultValue_local = data;
  data_local = (void **)key;
  key_local = (char *)this;
  pcStack_40 = Node::get(this->node,key);
  if (pcStack_40 == (char *)0x0) {
    if (pvStack_30 == (void *)0x0) {
      *(undefined8 *)defaultValue_local = 0;
    }
    else {
      pvVar1 = malloc((long)v._4_4_);
      *(void **)defaultValue_local = pvVar1;
      memmove(*defaultValue_local,pvStack_30,(long)v._4_4_);
    }
    this_local._7_1_ = '\0';
  }
  else {
    pvVar1 = decodeHex(pcStack_40,&local_44);
    *(void **)defaultValue_local = pvVar1;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

char Fl_Preferences::get( const char *key, void *&data, const void *defaultValue, int defaultSize ) {
  const char *v = node->get( key );
  if ( v ) {
    int dsize;
    data = decodeHex( v, dsize );
    return 1;
  }
  if ( defaultValue ) {
    data = (void*)malloc( defaultSize );
    memmove( data, defaultValue, defaultSize );
  }
  else
    data = 0;
  return 0;
}